

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O1

void __thiscall
JsrtDebugManager::ReportBreak(JsrtDebugManager *this,InterpreterHaltState *haltState)

{
  Utf8SourceInfo *this_00;
  ProbeList *pPVar1;
  code *pcVar2;
  bool bVar3;
  int byteOffset;
  FunctionBody *_pBody;
  undefined4 *puVar4;
  DynamicObject *object;
  DebugContext *pDVar5;
  DebugDocument *pDVar6;
  UINT value;
  long lVar7;
  BreakpointProbe *this_01;
  undefined1 local_60 [8];
  JsrtDebugEventObject debugEventObject;
  JsDiagDebugEvent local_34;
  
  if (this->debugEventCallback == (JsDiagDebugEventCallback)0x0) {
    return;
  }
  _pBody = Js::InterpreterHaltState::GetFunction(haltState);
  if (_pBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
                       ,0x100,"(functionBody != nullptr)","functionBody != nullptr");
    if (!bVar3) goto LAB_003a6ec0;
    *puVar4 = 0;
  }
  this_00 = (_pBody->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
  byteOffset = Js::InterpreterHaltState::GetCurrentOffset(haltState);
  debugEventObject.scriptContext = (this_00->m_scriptContext).ptr;
  switch(haltState->stopType) {
  case STOP_INLINEBREAKPOINT:
    local_34 = JsDiagDebugEventDebuggerStatement;
    break;
  case STOP_STEPCOMPLETE:
    local_34 = JsDiagDebugEventStepComplete;
    break;
  case STOP_EXCEPTIONTHROW:
    local_34 = JsDiagDebugEventRuntimeException;
    break;
  case STOP_ASYNCBREAK:
    local_34 = JsDiagDebugEventAsyncBreak;
    break;
  default:
    local_34 = JsDiagDebugEventBreakpoint;
    bVar3 = true;
    goto LAB_003a6d3b;
  }
  bVar3 = false;
LAB_003a6d3b:
  JsrtDebugEventObject::JsrtDebugEventObject
            ((JsrtDebugEventObject *)local_60,debugEventObject.scriptContext);
  object = JsrtDebugEventObject::GetEventDataObject((JsrtDebugEventObject *)local_60);
  pDVar5 = Js::ScriptContext::GetDebugContext(debugEventObject.scriptContext);
  if (bVar3) {
    pPVar1 = pDVar5->diagProbesContainer->diagProbeList;
    value = 0;
    if (0 < (pPVar1->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).count
       ) {
      this_01 = (BreakpointProbe *)
                *(pPVar1->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
                 buffer;
      pDVar6 = Js::Utf8SourceInfo::GetDebugDocument(this_00);
      bVar3 = Js::BreakpointProbe::Matches(this_01,_pBody,pDVar6,byteOffset);
      if (!bVar3) {
        lVar7 = 1;
        do {
          if ((pPVar1->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
              count <= lVar7) {
            value = 0;
            goto LAB_003a6e02;
          }
          this_01 = (BreakpointProbe *)
                    (pPVar1->
                    super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).buffer
                    [lVar7];
          pDVar6 = Js::Utf8SourceInfo::GetDebugDocument(this_00);
          bVar3 = Js::BreakpointProbe::Matches(this_01,_pBody,pDVar6,byteOffset);
          lVar7 = lVar7 + 1;
        } while (!bVar3);
      }
      value = this_01->breakpointId;
    }
LAB_003a6e02:
    if (value == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
                         ,0x11c,"(bpId != 0)",
                         "How come we don\'t have a breakpoint id for JsDiagDebugEventBreakpoint");
      if (!bVar3) {
LAB_003a6ec0:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    JsrtDebugUtils::AddPropertyToObject
              (object,(JsrtDebugPropertyId)0x1,value,debugEventObject.scriptContext);
  }
  JsrtDebugUtils::AddScriptIdToObject(object,this_00);
  JsrtDebugUtils::AddLineColumnToObject(object,_pBody,byteOffset);
  JsrtDebugUtils::AddSourceLengthAndTextToObject(object,_pBody,byteOffset);
  CallDebugEventCallbackForBreak(this,local_34,object,debugEventObject.scriptContext);
  JsrtDebugEventObject::~JsrtDebugEventObject((JsrtDebugEventObject *)local_60);
  return;
}

Assistant:

void JsrtDebugManager::ReportBreak(Js::InterpreterHaltState* haltState)
{
    if (this->debugEventCallback != nullptr)
    {
        Js::FunctionBody* functionBody = haltState->GetFunction();
        Assert(functionBody != nullptr);

        Js::Utf8SourceInfo* utf8SourceInfo = functionBody->GetUtf8SourceInfo();
        int currentByteCodeOffset = haltState->GetCurrentOffset();
        Js::ScriptContext* scriptContext = utf8SourceInfo->GetScriptContext();

        JsDiagDebugEvent jsDiagDebugEvent = this->GetDebugEventFromStopType(haltState->stopType);

        JsrtDebugEventObject debugEventObject(scriptContext);

        Js::DynamicObject* eventDataObject = debugEventObject.GetEventDataObject();

        Js::ProbeContainer* probeContainer = scriptContext->GetDebugContext()->GetProbeContainer();

        if (jsDiagDebugEvent == JsDiagDebugEventBreakpoint)
        {
            UINT bpId = 0;
            probeContainer->MapProbesUntil([&](int i, Js::Probe* pProbe)
            {
                Js::BreakpointProbe* bp = (Js::BreakpointProbe*)pProbe;
                if (bp->Matches(functionBody, utf8SourceInfo->GetDebugDocument(), currentByteCodeOffset))
                {
                    bpId = bp->GetId();
                    return true;
                }
                return false;
            });

            AssertMsg(bpId != 0, "How come we don't have a breakpoint id for JsDiagDebugEventBreakpoint");

            JsrtDebugUtils::AddPropertyToObject(eventDataObject, JsrtDebugPropertyId::breakpointId, bpId, scriptContext);
        }

        JsrtDebugUtils::AddScriptIdToObject(eventDataObject, utf8SourceInfo);
        JsrtDebugUtils::AddLineColumnToObject(eventDataObject, functionBody, currentByteCodeOffset);
        JsrtDebugUtils::AddSourceLengthAndTextToObject(eventDataObject, functionBody, currentByteCodeOffset);

        this->CallDebugEventCallbackForBreak(jsDiagDebugEvent, eventDataObject, scriptContext);
    }
}